

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindPrefixedConfig(cmFindPackageCommand *this)

{
  string *psVar1;
  bool bVar2;
  string *prefix_in;
  long lVar3;
  long lVar4;
  string *psVar5;
  
  prefix_in = (this->super_cmFindCommon).SearchPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_cmFindCommon).SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar1 - (long)prefix_in;
  for (lVar3 = lVar4 >> 7; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = SearchPrefix(this,prefix_in);
    psVar5 = prefix_in;
    if (bVar2) goto LAB_0034775c;
    bVar2 = SearchPrefix(this,prefix_in + 1);
    psVar5 = prefix_in + 1;
    if (bVar2) goto LAB_0034775c;
    bVar2 = SearchPrefix(this,prefix_in + 2);
    psVar5 = prefix_in + 2;
    if (bVar2) goto LAB_0034775c;
    bVar2 = SearchPrefix(this,prefix_in + 3);
    psVar5 = prefix_in + 3;
    if (bVar2) goto LAB_0034775c;
    prefix_in = prefix_in + 4;
    lVar4 = lVar4 + -0x80;
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      psVar5 = psVar1;
      if ((lVar4 != 3) || (bVar2 = SearchPrefix(this,prefix_in), psVar5 = prefix_in, bVar2))
      goto LAB_0034775c;
      prefix_in = prefix_in + 1;
    }
    bVar2 = SearchPrefix(this,prefix_in);
    psVar5 = prefix_in;
    if (bVar2) goto LAB_0034775c;
    prefix_in = prefix_in + 1;
  }
  bVar2 = SearchPrefix(this,prefix_in);
  psVar5 = prefix_in;
  if (!bVar2) {
    psVar5 = psVar1;
  }
LAB_0034775c:
  return psVar5 != psVar1;
}

Assistant:

bool cmFindPackageCommand::FindPrefixedConfig()
{
  std::vector<std::string> const& prefixes = this->SearchPaths;
  return std::any_of(
    prefixes.begin(), prefixes.end(),
    [this](std::string const& p) -> bool { return this->SearchPrefix(p); });
}